

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitSwitch(PrintExpressionContents *this,Switch *curr)

{
  ostream *stream;
  size_t sVar1;
  Name *pNVar2;
  ulong uVar3;
  long lVar4;
  char local_32 [2];
  
  stream = this->o;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"br_table",8);
  Colors::outputColorCode(stream,"\x1b[0m");
  sVar1 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
  if (sVar1 != 0) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      if ((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements <=
          uVar3) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
                     );
      }
      pNVar2 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
      local_32[1] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(this->o,local_32 + 1,1);
      Name::print((Name *)((long)&(pNVar2->super_IString).str._M_len + lVar4),this->o);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (sVar1 != uVar3);
  }
  local_32[0] = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(this->o,local_32,1);
  Name::print(&curr->default_,this->o);
  return;
}

Assistant:

void visitSwitch(Switch* curr) {
    printMedium(o, "br_table");
    for (auto& t : curr->targets) {
      o << ' ';
      t.print(o);
    }
    o << ' ';
    curr->default_.print(o);
  }